

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<unsigned_int>
          (BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,FloatSymEquivalenceClass **value)

{
  Type piVar1;
  uint uVar2;
  Type pSVar3;
  uint uVar4;
  
  piVar1 = this->buckets;
  uVar2 = 0;
  if (piVar1 != (Type)0x0) {
    uVar2 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar4 = piVar1[uVar2];
    uVar2 = 0;
    if (-1 < (int)uVar4) {
      pSVar3 = this->entries;
      uVar2 = 0;
      do {
        if (pSVar3[uVar4].
            super_DefaultHashedEntry<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*>.
            super_ValueEntry<BackwardPass::FloatSymEquivalenceClass_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*>.
            key == *key) {
          if (this->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(this->stats,uVar2);
            pSVar3 = this->entries;
          }
          *value = pSVar3[uVar4].
                   super_DefaultHashedEntry<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*>.
                   super_ValueEntry<BackwardPass::FloatSymEquivalenceClass_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*>_>
                   .
                   super_KeyValueEntryDataLayout2<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*>
                   .value;
          return true;
        }
        uVar2 = uVar2 + 1;
        uVar4 = pSVar3[uVar4].
                super_DefaultHashedEntry<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*>.
                super_ValueEntry<BackwardPass::FloatSymEquivalenceClass_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*>_>
                .
                super_KeyValueEntryDataLayout2<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*>
                .next;
      } while (-1 < (int)uVar4);
    }
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,uVar2);
  }
  return false;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }